

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Reprepare(Vdbe *p)

{
  long lVar1;
  u8 uVar2;
  Vdbe *pOld;
  sqlite3 *pToStmt;
  Vdbe *in_RDI;
  long in_FS_OFFSET;
  char **unaff_retaddr;
  u8 prepFlags;
  sqlite3 *db;
  char *zSql;
  int rc;
  sqlite3_stmt *pNew;
  undefined4 in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  u32 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -0x55555556;
  uVar3 = CONCAT13(0xaa,in_stack_ffffffffffffffc4);
  pOld = (Vdbe *)sqlite3_sql((sqlite3_stmt *)in_RDI);
  pToStmt = sqlite3VdbeDb(in_RDI);
  uVar2 = sqlite3VdbePrepareFlags(in_RDI);
  uVar3 = CONCAT13(uVar2,(int3)uVar3);
  iVar4 = sqlite3LockAndPrepare
                    ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (char *)in_RDI,iVar4,in_stack_ffffffffffffffd8,pOld,(sqlite3_stmt **)pToStmt,
                     unaff_retaddr);
  if (iVar4 == 0) {
    sqlite3VdbeSwap((Vdbe *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),in_RDI);
    sqlite3TransferBindings((sqlite3_stmt *)pOld,(sqlite3_stmt *)pToStmt);
    sqlite3VdbeResetStepResult((Vdbe *)&DAT_aaaaaaaaaaaaaaaa);
    sqlite3VdbeFinalize((Vdbe *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    iVar4 = 0;
  }
  else if (iVar4 == 7) {
    sqlite3OomFault((sqlite3 *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Reprepare(Vdbe *p){
  int rc;
  sqlite3_stmt *pNew;
  const char *zSql;
  sqlite3 *db;
  u8 prepFlags;

  assert( sqlite3_mutex_held(sqlite3VdbeDb(p)->mutex) );
  zSql = sqlite3_sql((sqlite3_stmt *)p);
  assert( zSql!=0 );  /* Reprepare only called for prepare_v2() statements */
  db = sqlite3VdbeDb(p);
  assert( sqlite3_mutex_held(db->mutex) );
  prepFlags = sqlite3VdbePrepareFlags(p);
  rc = sqlite3LockAndPrepare(db, zSql, -1, prepFlags, p, &pNew, 0);
  if( rc ){
    if( rc==SQLITE_NOMEM ){
      sqlite3OomFault(db);
    }
    assert( pNew==0 );
    return rc;
  }else{
    assert( pNew!=0 );
  }
  sqlite3VdbeSwap((Vdbe*)pNew, p);
  sqlite3TransferBindings(pNew, (sqlite3_stmt*)p);
  sqlite3VdbeResetStepResult((Vdbe*)pNew);
  sqlite3VdbeFinalize((Vdbe*)pNew);
  return SQLITE_OK;
}